

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::NegativeBindVertexBuffer::Run(NegativeBindVertexBuffer *this)

{
  CallLogWrapper *this_00;
  GLenum GVar1;
  char *format;
  GLint p;
  int local_1c;
  
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,1000,(void *)0x0,0x88e4);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,0,0x4d2,0,0xc);
  GVar1 = glu::CallLogWrapper::glGetError(this_00);
  if (GVar1 == 0x502) {
    glu::CallLogWrapper::glGetIntegerv(this_00,0x82da,&local_1c);
    glu::CallLogWrapper::glBindVertexBuffer(this_00,local_1c + 1,this->m_vbo,0,0xc);
    GVar1 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar1 == 0x501) {
      glu::CallLogWrapper::glBindVertexBuffer(this_00,0,this->m_vbo,-10,0xc);
      GVar1 = glu::CallLogWrapper::glGetError(this_00);
      if (GVar1 == 0x501) {
        glu::CallLogWrapper::glBindVertexBuffer(this_00,0,this->m_vbo,0,-0xc);
        GVar1 = glu::CallLogWrapper::glGetError(this_00);
        if (GVar1 == 0x501) {
          glu::CallLogWrapper::glGetIntegerv(this_00,0x82e5,&local_1c);
          glu::CallLogWrapper::glBindVertexBuffer(this_00,0,this->m_vbo,0,local_1c + 4);
          GVar1 = glu::CallLogWrapper::glGetError(this_00);
          if (GVar1 == 0x501) {
            glu::CallLogWrapper::glBindVertexArray(this_00,0);
            glu::CallLogWrapper::glBindVertexBuffer(this_00,0,this->m_vbo,0,0xc);
            GVar1 = glu::CallLogWrapper::glGetError(this_00);
            if (GVar1 == 0x502) {
              return 0;
            }
            format = "INVALID_OPERATION should be generated (default VAO).\n";
          }
          else {
            format = 
            "INVALID_VALUE should be generated (stride greater than GL_MAX_VERTEX_ATTRIB_STRIDE).\n"
            ;
          }
        }
        else {
          format = "INVALID_VALUE should be generated (negative stride).\n";
        }
      }
      else {
        format = "INVALID_VALUE should be generated (negative offset).\n";
      }
    }
    else {
      format = 
      "INVALID_VALUE should be generated (bindingIndex greater than GL_MAX_VERTEX_ATTRIB_BINDINGS).\n"
      ;
    }
  }
  else {
    format = "INVALID_OPERATION should be generated (buffer name not genned).\n";
  }
  anon_unknown_0::Output(format);
  return -1;
}

Assistant:

virtual long Run()
	{
		/*
		 Errors
		 An INVALID_OPERATION error is generated if buffer is not zero or a name
		 returned from a previous call to GenBuffers, or if such a name has since been
		 deleted with DeleteBuffers.
		 An INVALID_VALUE error is generated if bindingindex is greater than or
		 equal to the value of MAX_VERTEX_ATTRIB_BINDINGS.
		 OpenGL 4.4 (Core Profile) - July 21, 2013
		 10.3. VERTEX ARRAYS 315
		 An INVALID_VALUE error is generated if stride or offset is negative, or if
		 stride is greater than the value of MAX_VERTEX_ATTRIB_STRIDE.
		 An INVALID_OPERATION error is generated if no vertex array object is
		 bound.
		 */
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glBufferData(GL_ARRAY_BUFFER, 1000, NULL, GL_STATIC_DRAW);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);

		glBindVertexBuffer(0, 1234, 0, 12);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("INVALID_OPERATION should be generated (buffer name not genned).\n");
			return ERROR;
		}

		GLint p;
		glGetIntegerv(GL_MAX_VERTEX_ATTRIB_BINDINGS, &p);
		glBindVertexBuffer(p + 1, m_vbo, 0, 12);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated (bindingIndex greater than GL_MAX_VERTEX_ATTRIB_BINDINGS).\n");
			return ERROR;
		}

		glBindVertexBuffer(0, m_vbo, -10, 12);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated (negative offset).\n");
			return ERROR;
		}
		glBindVertexBuffer(0, m_vbo, 0, -12);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated (negative stride).\n");
			return ERROR;
		}

		glGetIntegerv(GL_MAX_VERTEX_ATTRIB_STRIDE, &p);
		glBindVertexBuffer(0, m_vbo, 0, p + 4);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated (stride greater than GL_MAX_VERTEX_ATTRIB_STRIDE).\n");
			return ERROR;
		}

		glBindVertexArray(0);
		glBindVertexBuffer(0, m_vbo, 0, 12);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("INVALID_OPERATION should be generated (default VAO).\n");
			return ERROR;
		}

		return NO_ERROR;
	}